

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppearanceConfigTab.cpp
# Opt level: O3

void __thiscall AppearanceConfigTab::chooseFont(AppearanceConfigTab *this)

{
  Fonts font_00;
  int iVar1;
  QPushButton *pQVar2;
  QFont *pQVar3;
  int index;
  array<QPushButton_*,_3UL> *paVar4;
  bool ok;
  QFont font;
  char local_51;
  QFont local_50 [16];
  QArrayData *local_40 [3];
  
  QObject::sender();
  pQVar2 = (QPushButton *)QMetaObject::cast((QObject *)&QPushButton::staticMetaObject);
  if (pQVar2 != (QPushButton *)0x0) {
    paVar4 = &this->mFontChooseButtons;
    if ((this->mFontChooseButtons)._M_elems[0] != pQVar2) {
      if ((this->mFontChooseButtons)._M_elems[1] == pQVar2) {
        paVar4 = (array<QPushButton_*,_3UL> *)((this->mFontChooseButtons)._M_elems + 1);
      }
      else {
        if ((this->mFontChooseButtons)._M_elems[2] != pQVar2) {
          return;
        }
        paVar4 = (array<QPushButton_*,_3UL> *)((this->mFontChooseButtons)._M_elems + 2);
      }
    }
    index = (int)((ulong)((long)paVar4 - (long)&this->mFontChooseButtons) >> 3);
    font_00 = *(Fonts *)(&DAT_001ff0a0 + (long)index * 0x10);
    pQVar3 = FontTable::operator[](this->mFonts,font_00);
    QMetaObject::tr((char *)local_40,(char *)&staticMetaObject,0x1b38b6);
    QFontDialog::getFont(local_50,&local_51,pQVar3,this,local_40,0x12);
    if (local_40[0] != (QArrayData *)0x0) {
      LOCK();
      (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40[0],2,8);
      }
    }
    if (local_51 == '\x01') {
      iVar1 = QFont::pointSize();
      if (0x16 < iVar1) {
        QFont::setPointSize((int)local_50);
      }
      FontTable::set(this->mFonts,font_00,local_50);
      updateFontButton(this,index);
      ConfigTab::setDirty<(Config::Category)2>(&this->super_ConfigTab);
    }
    QFont::~QFont(local_50);
  }
  return;
}

Assistant:

void AppearanceConfigTab::chooseFont() {
    auto button = qobject_cast<QPushButton*>(sender());
    if (button) {
        auto iter = std::find(mFontChooseButtons.begin(), mFontChooseButtons.end(), button);
        if (iter != mFontChooseButtons.end()) {
            int index = iter - mFontChooseButtons.begin();
            auto const& meta = TU::FontButtonMetas[index];

            bool ok;
            auto font = QFontDialog::getFont(
                &ok,
                mFonts[meta.index],
                this,
                tr("Select a font"),
                QFontDialog::DontUseNativeDialog | QFontDialog::MonospacedFonts
            );

            if (ok) {
                if (font.pointSize() > TU::MAX_POINT_SIZE) {
                    font.setPointSize(TU::MAX_POINT_SIZE);
                }

                mFonts.set(meta.index, font);
                updateFontButton(index);
                setDirty<Config::CategoryAppearance>();
            }

        }
    }
}